

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O2

int LSolve(N_Vector b,void *mem)

{
  int iVar1;
  
  if (mem == (void *)0x0) {
    printf("ERROR: Integrator memory is NULL");
    iVar1 = -1;
  }
  else {
    iVar1 = SUNLinSolSolve(0,*(undefined8 *)((long)mem + 0x30),*(undefined8 *)((long)mem + 0x28),
                           *(undefined8 *)((long)mem + 0x20),b);
    N_VScale(0x3ff0000000000000,*(undefined8 *)((long)mem + 0x20),b);
  }
  return iVar1;
}

Assistant:

int LSolve(N_Vector b, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  retval = SUNLinSolSolve(Imem->LS, Imem->A, Imem->x, b, ZERO);
  N_VScale(ONE, Imem->x, b);

  return (retval);
}